

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfile.c
# Opt level: O0

int bf_read(bfile_t *bfile,uint8_t *buffer,uint len)

{
  uint in_EDX;
  ulong uVar1;
  bfile_t *in_RSI;
  long in_RDI;
  size_t cpylen;
  size_t bufoff;
  size_t hasread;
  size_t toread;
  size_t local_48;
  ulong local_40;
  ulong local_28;
  
  local_28 = 0;
  if ((ulong)in_EDX < (ulong)(*(long *)(in_RDI + 0x10) - *(long *)(in_RDI + 0x18))) {
    local_40 = (ulong)in_EDX;
  }
  else {
    local_40 = *(long *)(in_RDI + 0x10) - *(long *)(in_RDI + 0x18);
  }
  while (local_28 < local_40) {
    if (*(ulong *)(in_RDI + 0x18) < *(ulong *)(in_RDI + 0x20)) {
      uVar1 = *(ulong *)(in_RDI + 0x18) % (ulong)*(uint *)(in_RDI + 0x38);
      if (*(uint *)(in_RDI + 0x38) - uVar1 < local_40 - local_28) {
        local_48 = *(uint *)(in_RDI + 0x38) - uVar1;
      }
      else {
        local_48 = local_40 - local_28;
      }
      memcpy((void *)((long)&in_RSI->flags + local_28),(void *)(*(long *)(in_RDI + 0x30) + uVar1),
             local_48);
      local_28 = local_48 + local_28;
      *(size_t *)(in_RDI + 0x18) = local_48 + *(long *)(in_RDI + 0x18);
    }
    else {
      bf_read_buffer(in_RSI);
    }
  }
  return (int)local_28;
}

Assistant:

int
bf_read(
    bfile_t * bfile,
    uint8_t * buffer,
    unsigned int len )
{
    size_t toread, hasread;

    assert( bfile != NULL );
    assert( (bfile->flags & BF_READABLE) != FALSE );

    hasread = 0;
    toread = PRF_MIN( len, bfile->size - bfile->pos ); /* crop read length */
    while ( hasread < toread ) {
        if ( bfile->pos < bfile->ipos ) {
            size_t bufoff;
            size_t cpylen;
            bufoff = bfile->pos % bfile->buffer_size;
            cpylen = PRF_MIN( bfile->buffer_size - bufoff, toread - hasread );
            memcpy( buffer + hasread, bfile->buffer + bufoff, cpylen );
            hasread += cpylen;
            bfile->pos += cpylen;
        } else {
            bf_read_buffer( bfile );
        }
    }

    return (int)hasread;
}